

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O2

TPZSavable * __thiscall
TPZRestoreClass<TPZEquationFilter>::Restore(TPZRestoreClass<TPZEquationFilter> *this)

{
  TPZSavable *pTVar1;
  
  pTVar1 = (TPZSavable *)operator_new(0x58);
  pTVar1->_vptr_TPZSavable = (_func_int **)&PTR__TPZEquationFilter_017d8460;
  pTVar1[1]._vptr_TPZSavable = (_func_int **)0x0;
  *(undefined1 *)&pTVar1[2]._vptr_TPZSavable = 0;
  pTVar1[3]._vptr_TPZSavable = (_func_int **)&PTR__TPZVec_01649268;
  pTVar1[6]._vptr_TPZSavable = (_func_int **)0x0;
  pTVar1[4]._vptr_TPZSavable = (_func_int **)0x0;
  pTVar1[5]._vptr_TPZSavable = (_func_int **)0x0;
  pTVar1[7]._vptr_TPZSavable = (_func_int **)&PTR__TPZVec_01649268;
  pTVar1[8]._vptr_TPZSavable = (_func_int **)0x0;
  pTVar1[9]._vptr_TPZSavable = (_func_int **)0x0;
  pTVar1[10]._vptr_TPZSavable = (_func_int **)0x0;
  return pTVar1;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }